

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuImage.cpp
# Opt level: O0

void convertInCoverMatrix
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *grid,vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      *coverMatrix)

{
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *pvVar1;
  int iVar2;
  reference this;
  reference pvVar3;
  reference pvVar4;
  iterator iVar5;
  _Bit_iterator __first;
  _Bit_iterator __last;
  bool local_71;
  _Bit_type *local_70;
  uint local_68;
  _Bit_type *local_60;
  uint local_58;
  _Bit_type *local_50;
  uint local_48;
  _Bit_type *local_40;
  uint local_38;
  int local_2c;
  int local_28;
  int num;
  int n;
  int column;
  int row;
  int header;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *coverMatrix_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *grid_local;
  
  column = 0;
  _row = coverMatrix;
  coverMatrix_local =
       (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        *)grid;
  column = createCellConstraints(coverMatrix,0);
  column = createRowConstraints(_row,column);
  column = createColumnConstraints(_row,column);
  createBoxConstraints(_row,column);
  for (n = 1; n < 10; n = n + 1) {
    for (num = 1; num < 10; num = num + 1) {
      this = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)coverMatrix_local,(long)(n + -1));
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this,(long)(num + -1));
      local_28 = *pvVar3;
      if (local_28 != 0) {
        for (local_2c = 1; pvVar1 = _row, local_2c < 10; local_2c = local_2c + 1) {
          if (local_2c != local_28) {
            iVar2 = indexInCoverMatrix(n,num,local_2c);
            pvVar4 = std::
                     vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     ::operator[](pvVar1,(long)iVar2);
            iVar5 = std::vector<bool,_std::allocator<bool>_>::begin(pvVar4);
            pvVar1 = _row;
            local_50 = iVar5.super__Bit_iterator_base._M_p;
            local_48 = iVar5.super__Bit_iterator_base._M_offset;
            local_40 = local_50;
            local_38 = local_48;
            iVar2 = indexInCoverMatrix(n,num,local_2c);
            pvVar4 = std::
                     vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     ::operator[](pvVar1,(long)iVar2);
            iVar5 = std::vector<bool,_std::allocator<bool>_>::end(pvVar4);
            local_70 = iVar5.super__Bit_iterator_base._M_p;
            local_68 = iVar5.super__Bit_iterator_base._M_offset;
            local_71 = false;
            __first.super__Bit_iterator_base._M_offset = local_38;
            __first.super__Bit_iterator_base._M_p = local_40;
            __first.super__Bit_iterator_base._12_4_ = 0;
            __last.super__Bit_iterator_base._12_4_ = 0;
            __last.super__Bit_iterator_base._M_p =
                 (_Bit_type *)SUB128(iVar5.super__Bit_iterator_base._0_12_,0);
            __last.super__Bit_iterator_base._M_offset =
                 SUB124(iVar5.super__Bit_iterator_base._0_12_,8);
            local_60 = local_70;
            local_58 = local_68;
            std::fill<std::_Bit_iterator,bool>(__first,__last,&local_71);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void convertInCoverMatrix(vector<vector<int>> &grid, vector<vector<bool>> &coverMatrix){
    //createCoverMatrix(coverMatrix);
    
    int header = 0;
    header = createCellConstraints(coverMatrix, header);
    header = createRowConstraints(coverMatrix, header);
    header = createColumnConstraints(coverMatrix, header);
    createBoxConstraints(coverMatrix, header);

    // Taking into account the values already entered in Sudoku's grid instance
    for (int row = COVER_START_INDEX; row <= SIZE; row++) {
      for (int column = COVER_START_INDEX; column <= SIZE; column++) {
        int n = grid[row - 1][column - 1];
        if (n != EMPTY_CELL) {
          for (int num = MIN_VALUE; num <= MAX_VALUE; num++) {
            if (num != n) {
                std::fill(coverMatrix[indexInCoverMatrix(row, column, num)].begin(), coverMatrix[indexInCoverMatrix(row, column, num)].end(), false);
            }
          }
        }
      }
    }
}